

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

LegacyScriptPubKeyMan * __thiscall wallet::CWallet::GetLegacyScriptPubKeyMan(CWallet *this)

{
  _Base_ptr p_Var1;
  LegacyScriptPubKeyMan *pLVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  
  if ((((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) &&
     (p_Var3 = (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent, p_Var3 != (_Base_ptr)0x0)) {
    p_Var4 = &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    do {
      if (-1 < (int)p_Var3[1]._M_color) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[p_Var3[1]._M_color >> 0x1f];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var1 != p_Var4) && ((int)p_Var1[1]._M_color < 1)) &&
       (p_Var1[1]._M_parent != (_Base_ptr)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        pLVar2 = (LegacyScriptPubKeyMan *)
                 __dynamic_cast(p_Var1[1]._M_parent,&ScriptPubKeyMan::typeinfo,
                                &LegacyScriptPubKeyMan::typeinfo,0);
        return pLVar2;
      }
      goto LAB_00c0d01e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (LegacyScriptPubKeyMan *)0x0;
  }
LAB_00c0d01e:
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan* CWallet::GetLegacyScriptPubKeyMan() const
{
    if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return nullptr;
    }
    // Legacy wallets only have one ScriptPubKeyMan which is a LegacyScriptPubKeyMan.
    // Everything in m_internal_spk_managers and m_external_spk_managers point to the same legacyScriptPubKeyMan.
    auto it = m_internal_spk_managers.find(OutputType::LEGACY);
    if (it == m_internal_spk_managers.end()) return nullptr;
    return dynamic_cast<LegacyScriptPubKeyMan*>(it->second);
}